

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

void cram_ref_incr_locked(refs_t *r,int id)

{
  int64_t *piVar1;
  ref_entry *prVar2;
  
  if ((-1 < id) && (prVar2 = r->ref_id[(uint)id], prVar2->seq != (char *)0x0)) {
    if (r->last_id == id) {
      r->last_id = -1;
    }
    piVar1 = &prVar2->count;
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

static void cram_ref_incr_locked(refs_t *r, int id) {
    RP("%d INC REF %d, %d %p\n", gettid(), id, (int)(id>=0?r->ref_id[id]->count+1:-999), id>=0?r->ref_id[id]->seq:(char *)1);

    if (id < 0 || !r->ref_id[id]->seq)
	return;

    if (r->last_id == id)
	r->last_id = -1;

    ++r->ref_id[id]->count;
}